

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib568.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char *__ptr;
  FILE *__stream;
  long lVar4;
  stat file_info;
  
  iVar1 = curl_global_init(3);
  iVar2 = 0x7e;
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    goto LAB_00101347;
  }
  iVar1 = curl_easy_setopt(lVar3,0x272d,_stdout);
  if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x2711,_stdout), iVar1 == 0)) &&
     (iVar1 = curl_easy_setopt(lVar3,0x2712,URL), iVar1 == 0)) {
    __ptr = suburl(URL,1);
    iVar1 = 0x7e;
    if (__ptr == (char *)0x0) goto LAB_0010130d;
    lVar4 = 0;
    iVar2 = curl_easy_setopt(lVar3,0x27cf,__ptr);
    if (iVar2 != 0) goto LAB_00101310;
    free(__ptr);
    iVar2 = open64("log/file568.txt",0);
    fstat64(iVar2,(stat64 *)&file_info);
    close(iVar2);
    __stream = fopen64("log/file568.txt","rb");
    if (__stream == (FILE *)0x0) {
      curl_mfprintf(_stderr,"can\'t open log/file568.txt\n");
      goto LAB_0010130d;
    }
    iVar2 = curl_easy_setopt(lVar3,0xbd,3);
    if ((((iVar2 != 0) || (iVar2 = curl_easy_setopt(lVar3,0x2719,__stream), iVar2 != 0)) ||
        ((iVar2 = curl_easy_setopt(lVar3,0x2e,1), iVar2 != 0 ||
         ((iVar2 = curl_easy_setopt(lVar3,0x75a3,file_info.st_size), iVar2 != 0 ||
          (iVar2 = curl_easy_perform(lVar3), iVar2 != 0)))))) ||
       (iVar2 = curl_easy_setopt(lVar3,0x2e,0), iVar2 != 0)) {
      fclose(__stream);
      iVar1 = iVar2;
      goto LAB_0010130d;
    }
    fclose(__stream);
    __ptr = suburl(URL,2);
    if (__ptr == (char *)0x0) goto LAB_0010130d;
    lVar4 = 0;
    iVar2 = curl_easy_setopt(lVar3,0x27cf,__ptr);
    if (iVar2 != 0) goto LAB_00101310;
    free(__ptr);
    lVar4 = 0;
    iVar2 = curl_easy_setopt(lVar3,0xbd,2);
    if (iVar2 == 0) {
      iVar2 = curl_easy_perform(lVar3);
      if (iVar2 != 0) {
        lVar4 = 0;
        goto LAB_001014f4;
      }
      __ptr = suburl(URL,3);
      if (__ptr == (char *)0x0) goto LAB_0010130d;
      lVar4 = 0;
      iVar2 = curl_easy_setopt(lVar3,0x27cf,__ptr);
      if (iVar2 == 0) {
        free(__ptr);
        __ptr = (char *)0x0;
        lVar4 = curl_slist_append(0,"Content-Type: posty goodness");
        if (lVar4 == 0) {
          lVar4 = 0;
          iVar2 = iVar1;
        }
        else {
          __ptr = (char *)0x0;
          iVar2 = curl_easy_setopt(lVar3,0x2727,lVar4);
          if (iVar2 == 0) {
            __ptr = (char *)0x0;
            iVar2 = curl_easy_setopt(lVar3,0xbd,3);
            if (iVar2 == 0) {
              __ptr = (char *)0x0;
              iVar2 = curl_easy_setopt(lVar3,0x271f,"postyfield=postystuff&project=curl\n");
              if (iVar2 == 0) {
                iVar2 = curl_easy_perform(lVar3);
                if (iVar2 != 0) goto LAB_001014f4;
                __ptr = (char *)0x0;
                iVar2 = curl_easy_setopt(lVar3,0x271f,0);
                if (iVar2 == 0) {
                  __ptr = (char *)0x0;
                  iVar2 = curl_easy_setopt(lVar3,0x2727,0);
                  if (iVar2 == 0) {
                    curl_slist_free_all(lVar4);
                    __ptr = suburl(URL,4);
                    if (__ptr != (char *)0x0) {
                      lVar4 = 0;
                      iVar2 = curl_easy_setopt(lVar3,0x27cf,__ptr);
                      if (iVar2 != 0) goto LAB_00101310;
                      free(__ptr);
                      iVar1 = curl_easy_setopt(lVar3,0xbd,1);
                      if (iVar1 == 0) {
                        iVar1 = curl_easy_perform(lVar3);
                      }
                    }
                    goto LAB_0010130d;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
LAB_001014f4:
      __ptr = (char *)0x0;
    }
  }
  else {
LAB_0010130d:
    lVar4 = 0;
    __ptr = (char *)0x0;
    iVar2 = iVar1;
  }
LAB_00101310:
  free(__ptr);
  if (lVar4 != 0) {
    curl_slist_free_all(lVar4);
  }
  curl_easy_cleanup(lVar3);
LAB_00101347:
  curl_global_cleanup();
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  int sdp;
  FILE *sdpf = NULL;
  struct_stat file_info;
  char *stream_uri = NULL;
  int request = 1;
  struct curl_slist *custom_headers = NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);

  test_setopt(curl, CURLOPT_URL, URL);

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  sdp = open("log/file568.txt", O_RDONLY);
  fstat(sdp, &file_info);
  close(sdp);

  sdpf = fopen("log/file568.txt", "rb");
  if(sdpf == NULL) {
    fprintf(stderr, "can't open log/file568.txt\n");
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_ANNOUNCE);

  test_setopt(curl, CURLOPT_READDATA, sdpf);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_INFILESIZE_LARGE, (curl_off_t) file_info.st_size);

  /* Do the ANNOUNCE */
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_UPLOAD, 0L);
  fclose(sdpf);
  sdpf = NULL;

  /* Make sure we can do a normal request now */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_DESCRIBE);
  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* Now do a POST style one */

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  custom_headers = curl_slist_append(custom_headers,
                                     "Content-Type: posty goodness");
  if(!custom_headers) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSPHEADER, custom_headers);
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_ANNOUNCE);
  test_setopt(curl, CURLOPT_POSTFIELDS,
              "postyfield=postystuff&project=curl\n");

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  test_setopt(curl, CURLOPT_POSTFIELDS, NULL);
  test_setopt(curl, CURLOPT_RTSPHEADER, NULL);
  curl_slist_free_all(custom_headers);
  custom_headers = NULL;

  /* Make sure we can do a normal request now */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_OPTIONS);
  res = curl_easy_perform(curl);

test_cleanup:

  if(sdpf)
    fclose(sdpf);

  free(stream_uri);

  if(custom_headers)
    curl_slist_free_all(custom_headers);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}